

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall MipsParser::parseWb(MipsParser *this,Parser *parser)

{
  Identifier *this_00;
  string_view local_38;
  Token *local_28;
  Token *token;
  Parser *parser_local;
  MipsParser *this_local;
  
  token = (Token *)parser;
  parser_local = (Parser *)this;
  local_28 = Parser::nextToken(parser);
  if (local_28->type == Identifier) {
    this_00 = Token::identifierValue(local_28);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"wb");
    this_local._7_1_ = Identifier::operator==(this_00,local_38);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MipsParser::parseWb(Parser& parser)
{
	const Token& token = parser.nextToken();
	if (token.type != TokenType::Identifier)
		return false;

	return token.identifierValue() == "wb";
}